

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# failure.h
# Opt level: O3

void ublib::impl::failwith_rec<char_const*,char[20]>(char **t,char (*ts) [20])

{
  char *__s;
  size_t sVar1;
  
  __s = *t;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10b190);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar1);
  }
  failwith_rec<char[20]>(ts);
  return;
}

Assistant:

void failwith_rec(T const& t, Ts const&... ts) {
    std::cerr << t;
    failwith_rec(ts...);
  }